

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O2

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::RegisterConstant
          (ConstantManager *this,
          unique_ptr<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
          *cst)

{
  __ireturn_type _Var1;
  _Head_base<0UL,_spvtools::opt::analysis::Constant_*,_false> local_20;
  
  local_20._M_head_impl =
       (cst->_M_t).
       super___uniq_ptr_impl<spvtools::opt::analysis::Constant,_std::default_delete<spvtools::opt::analysis::Constant>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::analysis::Constant_*,_std::default_delete<spvtools::opt::analysis::Constant>_>
       .super__Head_base<0UL,_spvtools::opt::analysis::Constant_*,_false>._M_head_impl;
  _Var1 = std::__detail::
          _Insert<const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>,_std::__detail::_Identity,_spvtools::opt::analysis::ConstantEqual,_spvtools::opt::analysis::ConstantHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
          ::insert((_Insert<const_spvtools::opt::analysis::Constant_*,_const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>,_std::__detail::_Identity,_spvtools::opt::analysis::ConstantEqual,_spvtools::opt::analysis::ConstantHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
                    *)&this->const_pool_,&local_20._M_head_impl);
  if (((undefined1  [16])_Var1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    std::
    vector<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>>
    ::
    emplace_back<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>
              ((vector<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>,std::allocator<std::unique_ptr<spvtools::opt::analysis::Constant,std::default_delete<spvtools::opt::analysis::Constant>>>>
                *)&this->owned_constants_,cst);
  }
  return *(Constant **)
          ((long)_Var1.first.
                 super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true>._M_cur.
                 super__Node_iterator_base<const_spvtools::opt::analysis::Constant_*,_true> + 8);
}

Assistant:

const Constant* RegisterConstant(std::unique_ptr<Constant> cst) {
    auto ret = const_pool_.insert(cst.get());
    if (ret.second) {
      owned_constants_.emplace_back(std::move(cst));
    }
    return *ret.first;
  }